

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu_common.c
# Opt level: O1

RK_S32 check_8_pixel_aligned
                 (RK_S32 workaround,RK_S32 hor_stride,RK_S32 pixel_aign,RK_S32 pixel_size,
                 char *fmt_name)

{
  int iVar1;
  uint uVar2;
  
  if (workaround != 0) {
    return workaround;
  }
  iVar1 = hor_stride + pixel_aign * pixel_size + -1;
  uVar2 = iVar1 - iVar1 % (pixel_aign * pixel_size);
  if (uVar2 != hor_stride) {
    _mpp_log_l(4,"vepu_common",
               "warning: vepu only support 8 aligned horizontal stride in pixel for %s with pixel size %d\n"
               ,(char *)0x0,fmt_name,(ulong)(uint)pixel_size,0);
    _mpp_log_l(4,"vepu_common","set byte stride to %d to match the requirement\n",(char *)0x0,
               (ulong)uVar2);
  }
  return (uint)(uVar2 != hor_stride);
}

Assistant:

static RK_S32 check_8_pixel_aligned(RK_S32 workaround, RK_S32 hor_stride,
                                    RK_S32 pixel_aign, RK_S32 pixel_size,
                                    const char *fmt_name)
{
    if (!workaround && hor_stride != MPP_ALIGN_GEN(hor_stride, pixel_aign * pixel_size)) {
        mpp_log("warning: vepu only support 8 aligned horizontal stride in pixel for %s with pixel size %d\n",
                fmt_name, pixel_size);
        mpp_log("set byte stride to %d to match the requirement\n",
                MPP_ALIGN_GEN(hor_stride, pixel_aign * pixel_size));
        workaround = 1;
    }

    return workaround;
}